

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fct.h
# Opt level: O3

void fct_switch_std_to_buffer(int *std_pipe,FILE *out,int fileno_,int *save_handle)

{
  int iVar1;
  
  fflush((FILE *)out);
  iVar1 = dup(fileno_);
  *save_handle = iVar1;
  iVar1 = pipe(std_pipe);
  if (iVar1 == 0) {
    dup2(std_pipe[1],fileno_);
    close(std_pipe[1]);
    return;
  }
  exit(1);
}

Assistant:

static void
fct_switch_std_to_buffer(int std_pipe[2], FILE *out, int fileno_, int *save_handle)
{
    fflush(out);
    *save_handle = _fct_dup(fileno_);
    if ( _fct_pipe(std_pipe) != 0 )
    {
        exit(1);
    }
    _fct_dup2(std_pipe[1], fileno_);
    _fct_close(std_pipe[1]);
}